

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seismogram.cpp
# Opt level: O0

void __thiscall
CombinedSeismogramm<float,_3>::Load
          (CombinedSeismogramm<float,_3> *this,SeismoType type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  pointer *this_00;
  uint16 uVar1;
  uint16 uVar2;
  byte bVar3;
  bool bVar4;
  _Ios_Openmode _Var5;
  uint uVar6;
  size_type sVar7;
  ulong uVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  char *pcVar12;
  reference pvVar13;
  ostream *poVar14;
  reference pvVar15;
  long lVar16;
  vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_> *this_01;
  float fVar17;
  float fVar18;
  float fVar19;
  double dVar20;
  uint local_b88;
  uint local_b84;
  int i_4;
  IndexType k_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v_1;
  float source_y;
  float source_x;
  ifstream ifs_source;
  undefined1 local_958 [8];
  string filename_source;
  value_type_conflict local_930;
  uint local_92c;
  float local_928;
  IndexType i_3;
  undefined1 local_920 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  undefined1 local_900 [4];
  IndexType i_2;
  vector<float,_std::allocator<float>_> rec_y;
  vector<float,_std::allocator<float>_> rec_x;
  ifstream ifs_rec;
  undefined1 local_6c8 [8];
  string filename_rec;
  IndexType k_2;
  int i_1;
  int i;
  segy_bin_header_data header_data;
  float interval;
  uint local_4ec;
  uint local_4e8;
  int trace_i_1;
  IndexType time_i;
  int k_1;
  int trace_i;
  int k;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c0;
  istream local_4a8 [8];
  ifstream ifs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a0;
  undefined1 local_288 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  line;
  long local_260;
  ifstream ifs0;
  uint local_50;
  IndexType num_of_receivers;
  IndexType num_of_all_traces;
  IndexType num_of_times;
  string filename;
  IndexType path_index;
  IndexType p;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paths_local;
  SeismoType type_local;
  CombinedSeismogramm<float,_3> *this_local;
  
  sVar7 = std::
          vector<CombinedSeismogramm<float,_3>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_3>::ComponentInfo>_>
          ::size(&this->componentInfos);
  std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::resize
            (&this->seismogramms,sVar7);
  if (type == SEG_Y) {
    for (filename.field_2._12_4_ = 0; uVar8 = (ulong)(uint)filename.field_2._12_4_,
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(paths), uVar8 < sVar7; filename.field_2._12_4_ = filename.field_2._12_4_ + 1)
    {
      pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                         (&this->seismogramms,(ulong)(uint)filename.field_2._12_4_);
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](paths,(ulong)(uint)filename.field_2._12_4_);
      Seismogramm<float>::LoadSegY(pvVar9,pvVar10,&this->times);
    }
  }
  else if (type == CSV) {
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(paths);
    std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::resize
              (&this->seismogramms,sVar7 * 3);
    for (filename.field_2._8_4_ = 0; uVar8 = (ulong)(uint)filename.field_2._8_4_,
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(paths), uVar8 < sVar7; filename.field_2._8_4_ = filename.field_2._8_4_ + 1) {
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](paths,(ulong)(uint)filename.field_2._8_4_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &num_of_all_traces,pvVar10,".csv");
      num_of_receivers = 0xffffffff;
      std::ifstream::ifstream(&local_260);
      _Var5 = std::__cxx11::string::c_str();
      std::ifstream::open((char *)&local_260,_Var5);
      bVar3 = std::ios::operator!((ios *)((long)&local_260 + *(long *)(local_260 + -0x18)));
      if ((bVar3 & 1) != 0) {
        poVar14 = std::operator<<((ostream *)&std::cout,"Error in reading CSV file.");
        std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
        poVar14 = std::operator<<((ostream *)&std::cout,"There is no such file: ");
        poVar14 = std::operator<<(poVar14,(string *)&num_of_all_traces);
        std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
      getNextLineAndSplitIntoTokens_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_288,(istream *)&local_260,';');
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_288);
      local_50 = (int)sVar7 - 1;
      uVar6 = local_50 / 3;
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_288);
      bVar4 = std::operator==(pvVar10,"\r");
      if (bVar4) {
        local_50 = (int)sVar7 - 2;
      }
      while (sVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_288), local_50 + 1 <= sVar7) {
        getNextLineAndSplitIntoTokens_abi_cxx11_(&local_2a0,(istream *)&local_260,';');
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_288,&local_2a0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2a0);
        num_of_receivers = num_of_receivers + 1;
      }
      std::ifstream::close();
      std::ifstream::ifstream(local_4a8);
      _Var5 = std::__cxx11::string::c_str();
      std::ifstream::open((char *)local_4a8,_Var5);
      getNextLineAndSplitIntoTokens_abi_cxx11_(&local_4c0,local_4a8,';');
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_4c0);
      getNextLineAndSplitIntoTokens_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&trace_i,local_4a8,';');
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_288,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&trace_i);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&trace_i);
      for (k_1 = 0; k_1 < 3; k_1 = k_1 + 1) {
        pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::at
                           (&this->seismogramms,(ulong)(uint)(filename.field_2._8_4_ * 3 + k_1));
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_288);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::resize(&pvVar9->data,(sVar7 - 1) / 3);
      }
      for (time_i = 0; time_i < uVar6; time_i = time_i + 1) {
        for (trace_i_1 = 0; trace_i_1 < 3; trace_i_1 = trace_i_1 + 1) {
          pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::at
                             (&this->seismogramms,
                              (ulong)(uint)(filename.field_2._8_4_ * 3 + trace_i_1));
          pvVar11 = std::
                    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ::operator[](&pvVar9->data,(long)(int)time_i);
          std::vector<float,_std::allocator<float>_>::resize(pvVar11,(ulong)num_of_receivers);
        }
      }
      std::vector<float,_std::allocator<float>_>::resize(&this->times,(ulong)num_of_receivers);
      local_4e8 = 0;
      while (sVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_288), local_50 + 1 <= sVar7) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_288,0);
        pcVar12 = (char *)std::__cxx11::string::c_str();
        dVar20 = atof(pcVar12);
        pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                            (&this->times,(ulong)local_4e8);
        *pvVar13 = (float)dVar20;
        for (local_4ec = 0; local_4ec < uVar6; local_4ec = local_4ec + 1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_288,(long)(int)(local_4ec * 3 + 1));
          pcVar12 = (char *)std::__cxx11::string::c_str();
          dVar20 = atof(pcVar12);
          pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::at
                             (&this->seismogramms,(ulong)(uint)(filename.field_2._8_4_ * 3));
          pvVar11 = std::
                    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ::operator[](&pvVar9->data,(long)(int)local_4ec);
          pvVar13 = std::vector<float,_std::allocator<float>_>::operator[](pvVar11,(ulong)local_4e8)
          ;
          *pvVar13 = (float)dVar20;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_288,(long)(int)(local_4ec * 3 + 2));
          pcVar12 = (char *)std::__cxx11::string::c_str();
          dVar20 = atof(pcVar12);
          pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::at
                             (&this->seismogramms,(ulong)(filename.field_2._8_4_ * 3 + 1));
          pvVar11 = std::
                    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ::operator[](&pvVar9->data,(long)(int)local_4ec);
          pvVar13 = std::vector<float,_std::allocator<float>_>::operator[](pvVar11,(ulong)local_4e8)
          ;
          *pvVar13 = (float)dVar20;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_288,(long)(int)(local_4ec * 3 + 3));
          pcVar12 = (char *)std::__cxx11::string::c_str();
          dVar20 = atof(pcVar12);
          pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::at
                             (&this->seismogramms,(ulong)(filename.field_2._8_4_ * 3 + 2));
          pvVar11 = std::
                    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ::operator[](&pvVar9->data,(long)(int)local_4ec);
          pvVar13 = std::vector<float,_std::allocator<float>_>::operator[](pvVar11,(ulong)local_4e8)
          ;
          *pvVar13 = (float)dVar20;
        }
        getNextLineAndSplitIntoTokens_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(header_data.reserve + 0xa8),local_4a8,';');
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_288,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(header_data.reserve + 0xa8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(header_data.reserve + 0xa8));
        local_4e8 = local_4e8 + 1;
      }
      pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                          (&this->times,(ulong)(num_of_receivers - 1));
      fVar17 = *pvVar13;
      pvVar13 = std::vector<float,_std::allocator<float>_>::operator[](&this->times,0);
      header_data.reserve._332_4_ = (fVar17 - *pvVar13) / (float)(num_of_receivers - 1);
      interpolate_data_on_equal_time_intervals
                (this,(float)header_data.reserve._332_4_ * this->interpolation_multiplier);
      sVar7 = std::vector<float,_std::allocator<float>_>::size(&this->times);
      pvVar13 = std::vector<float,_std::allocator<float>_>::operator[](&this->times,1);
      fVar17 = *pvVar13;
      pvVar13 = std::vector<float,_std::allocator<float>_>::operator[](&this->times,0);
      header_data.reserve._332_4_ = fVar17 - *pvVar13;
      dVar20 = floor((double)(float)header_data.reserve._332_4_ * 1000000.0 + 0.5);
      header_data.reel_num._0_2_ = (uint16)(long)dVar20;
      i_1 = 1;
      i = 1;
      header_data.line_num._0_2_ = (undefined2)uVar6;
      header_data.line_num._2_2_ = 0;
      header_data.sample_interval_reel = 5;
      header_data.job_id = 1;
      header_data.num_of_traces_per_record = (uint16)sVar7;
      for (k_2 = 0; (int)k_2 < 0x11; k_2 = k_2 + 1) {
        header_data.other[(long)(int)k_2 + -4] = 0;
      }
      for (filename_rec.field_2._12_4_ = 0; (int)filename_rec.field_2._12_4_ < 0xaa;
          filename_rec.field_2._12_4_ = filename_rec.field_2._12_4_ + 1) {
        header_data.other[(long)(int)filename_rec.field_2._12_4_ + 0xd] = 0;
      }
      header_data.reel_num._2_2_ = (uint16)header_data.reel_num;
      header_data.num_of_auxiliary_traces_per_record = header_data.num_of_traces_per_record;
      for (filename_rec.field_2._8_4_ = 0; (uint)filename_rec.field_2._8_4_ < 3;
          filename_rec.field_2._8_4_ = filename_rec.field_2._8_4_ + 1) {
        pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                           (&this->seismogramms,
                            (ulong)(uint)(filename.field_2._8_4_ * 3 + filename_rec.field_2._8_4_));
        memcpy(&pvVar9->header_data,&i_1,400);
      }
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](paths,(ulong)(uint)filename.field_2._8_4_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8,
                     pvVar10,".receivers.csv");
      std::ifstream::ifstream
                (&rec_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      _Var5 = std::__cxx11::string::c_str();
      std::ifstream::open((char *)&rec_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage,_Var5);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)
                 &rec_y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_900);
      bVar4 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&rec_x.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage +
                                *(long *)(rec_x.super__Vector_base<float,_std::allocator<float>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage + -6)));
      if (bVar4) {
        for (v.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            v.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < uVar6;
            v.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                 v.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
          getNextLineAndSplitIntoTokens_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_920,
                     (istream *)
                     &rec_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,';');
          sVar7 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_920);
          if (sVar7 < 2) {
            poVar14 = std::operator<<((ostream *)&std::cout,"Error while reading receivers data");
            std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_920,0);
            pcVar12 = (char *)std::__cxx11::string::c_str();
            dVar20 = atof(pcVar12);
            i_3 = (IndexType)(float)dVar20;
            std::vector<float,_std::allocator<float>_>::push_back
                      ((vector<float,_std::allocator<float>_> *)
                       &rec_y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(value_type_conflict *)&i_3);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_920,1);
            pcVar12 = (char *)std::__cxx11::string::c_str();
            dVar20 = atof(pcVar12);
            local_928 = (float)dVar20;
            std::vector<float,_std::allocator<float>_>::push_back
                      ((vector<float,_std::allocator<float>_> *)local_900,&local_928);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_920);
        }
      }
      else {
        poVar14 = std::operator<<((ostream *)&std::cout,"Warning: no csv receivers data found");
        std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
        poVar14 = std::operator<<((ostream *)&std::cout,
                                  "         All receivers positions have been set to (0.0, 0.0)");
        std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
        for (local_92c = 0; local_92c < uVar6; local_92c = local_92c + 1) {
          local_930 = 0.0;
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)
                     &rec_y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&local_930);
          filename_source.field_2._12_4_ = 0;
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)local_900,
                     (value_type_conflict *)((long)&filename_source.field_2 + 0xc));
        }
      }
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](paths,(ulong)(uint)filename.field_2._8_4_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_958,
                     pvVar10,".source.csv");
      std::ifstream::ifstream(&source_y);
      _Var5 = std::__cxx11::string::c_str();
      std::ifstream::open((char *)&source_y,_Var5);
      bVar4 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&source_y + *(long *)(_source_y + -0x18)));
      if (bVar4) {
        getNextLineAndSplitIntoTokens_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&i_4,(istream *)&source_y,';');
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&i_4);
        if (sVar7 < 2) {
          poVar14 = std::operator<<((ostream *)&std::cout,"Error while reading source data");
          std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i_4,0);
          pcVar12 = (char *)std::__cxx11::string::c_str();
          dVar20 = atof(pcVar12);
          v_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (float)dVar20;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i_4,1);
          pcVar12 = (char *)std::__cxx11::string::c_str();
          dVar20 = atof(pcVar12);
          v_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (float)dVar20;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&i_4);
      }
      else {
        poVar14 = std::operator<<((ostream *)&std::cout,"Warning: no csv source data found");
        std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
        poVar14 = std::operator<<((ostream *)&std::cout,
                                  "         Source position has been set to (0.0, 0.0)");
        std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
        v_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0.0;
        v_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0.0;
      }
      for (local_b84 = 0; local_b84 < 3; local_b84 = local_b84 + 1) {
        pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                           (&this->seismogramms,(ulong)(filename.field_2._8_4_ * 3 + local_b84));
        std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::resize
                  (&pvVar9->trace_header_data,(ulong)uVar6);
        for (local_b88 = 0; local_b88 < uVar6; local_b88 = local_b88 + 1) {
          this_01 = &this->seismogramms;
          pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                             (this_01,(ulong)(filename.field_2._8_4_ * 3 + local_b84));
          pvVar15 = std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::operator[]
                              (&pvVar9->trace_header_data,(long)(int)local_b88);
          pvVar15->trace_seq_num_line = local_b88;
          pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                             (this_01,(ulong)(filename.field_2._8_4_ * 3 + local_b84));
          pvVar15 = std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::operator[]
                              (&pvVar9->trace_header_data,(long)(int)local_b88);
          pvVar15->trace_seq_num_reel = local_b88;
          pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                             (this_01,(ulong)(filename.field_2._8_4_ * 3 + local_b84));
          pvVar15 = std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::operator[]
                              (&pvVar9->trace_header_data,(long)(int)local_b88);
          pvVar15->trace_id_code = (uint16)local_b88;
          this_00 = &rec_y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)this_00,(long)(int)local_b88
                              );
          fVar17 = *pvVar13;
          pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                             (this_01,(ulong)(filename.field_2._8_4_ * 3 + local_b84));
          pvVar15 = std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::operator[]
                              (&pvVar9->trace_header_data,(long)(int)local_b88);
          pvVar15->receiver_x = (uint32)(long)fVar17;
          pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_900,
                               (long)(int)local_b88);
          fVar17 = *pvVar13;
          pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                             (this_01,(ulong)(filename.field_2._8_4_ * 3 + local_b84));
          pvVar15 = std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::operator[]
                              (&pvVar9->trace_header_data,(long)(int)local_b88);
          pvVar15->receiver_y = (uint32)(long)fVar17;
          lVar16 = (long)v_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                             (this_01,(ulong)(filename.field_2._8_4_ * 3 + local_b84));
          pvVar15 = std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::operator[]
                              (&pvVar9->trace_header_data,(long)(int)local_b88);
          pvVar15->source_x = (uint32)lVar16;
          lVar16 = (long)v_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
          pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                             (this_01,(ulong)(filename.field_2._8_4_ * 3 + local_b84));
          pvVar15 = std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::operator[]
                              (&pvVar9->trace_header_data,(long)(int)local_b88);
          pvVar15->source_y = (uint32)lVar16;
          pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                             (this_01,(ulong)(filename.field_2._8_4_ * 3 + local_b84));
          pvVar15 = std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::operator[]
                              (&pvVar9->trace_header_data,(long)(int)local_b88);
          uVar2 = header_data.num_of_auxiliary_traces_per_record;
          pvVar15->field_record_num = 1;
          pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                             (this_01,(ulong)(filename.field_2._8_4_ * 3 + local_b84));
          pvVar15 = std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::operator[]
                              (&pvVar9->trace_header_data,(long)(int)local_b88);
          uVar1 = header_data.reel_num._2_2_;
          pvVar15->num_of_samples = uVar2;
          pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                             (this_01,(ulong)(filename.field_2._8_4_ * 3 + local_b84));
          pvVar15 = std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::operator[]
                              (&pvVar9->trace_header_data,(long)(int)local_b88);
          pvVar15->sample_interval = uVar1;
          pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                             (this_01,(ulong)(filename.field_2._8_4_ * 3 + local_b84));
          pvVar15 = std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::operator[]
                              (&pvVar9->trace_header_data,(long)(int)local_b88);
          pvVar15->trace_num_reel = 1;
          pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                             (this_01,(ulong)(filename.field_2._8_4_ * 3 + local_b84));
          pvVar15 = std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::operator[]
                              (&pvVar9->trace_header_data,(long)(int)local_b88);
          pvVar15->units_id = 1;
          pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)this_00,(long)(int)local_b88
                              );
          fVar17 = *pvVar13 -
                   v_1.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)this_00,(long)(int)local_b88
                              );
          fVar18 = *pvVar13 -
                   v_1.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_900,
                               (long)(int)local_b88);
          fVar19 = *pvVar13 -
                   v_1.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
          pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_900,
                               (long)(int)local_b88);
          dVar20 = sqrt((double)(fVar17 * fVar18 +
                                fVar19 * (*pvVar13 -
                                         v_1.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_))
                        + 0.5);
          pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                             (&this->seismogramms,(ulong)(filename.field_2._8_4_ * 3 + local_b84));
          pvVar15 = std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::operator[]
                              (&pvVar9->trace_header_data,(long)(int)local_b88);
          pvVar15->distance_from_source = (uint32)(long)dVar20;
        }
      }
      std::ifstream::~ifstream(&source_y);
      std::__cxx11::string::~string((string *)local_958);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_900);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)
                 &rec_y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::ifstream::~ifstream
                (&rec_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)local_6c8);
      std::ifstream::~ifstream(local_4a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_288);
      std::ifstream::~ifstream(&local_260);
      std::__cxx11::string::~string((string *)&num_of_all_traces);
    }
  }
  return;
}

Assistant:

void CombinedSeismogramm<Scalar, dims>::Load(SeismoType type, std::vector<std::string> paths)
{
    seismogramms.resize(componentInfos.size());
    if (type == SEG_Y)
    {
        for (IndexType p = 0; p < paths.size(); ++p)
        {
            seismogramms[p].LoadSegY(paths[p], times);
        }
    }
    else if (type == CSV)
    {
        seismogramms.resize(paths.size() * dims);
        for (IndexType path_index = 0; path_index < paths.size(); path_index++)
        {
            // Calculating number of time steps and number of traces
            // ///////////////////////////////////////
            std::string filename = paths[path_index] + ".csv";
            IndexType num_of_times = -1;
            IndexType num_of_all_traces = 0;
            IndexType num_of_receivers;
            std::ifstream ifs0;
            ifs0.open(filename.c_str());
            if (!ifs0)
            {
                std::cout << "Error in reading CSV file." << std::endl;
                std::cout << "There is no such file: " << filename << std::endl;
                std::exit(1);
            }
            std::vector<std::string> line = getNextLineAndSplitIntoTokens(ifs0);
            num_of_all_traces = line.size() - 1;
            num_of_receivers = num_of_all_traces / dims;
            if (line.back() == "\r") num_of_all_traces -= 1;
            while (line.size() >= num_of_all_traces + 1)
            {
                line = getNextLineAndSplitIntoTokens(ifs0);
                num_of_times++;
            }
            ifs0.close();

            // Reading  data
            // ///////////////////////////////////////
            std::ifstream ifs;
            ifs.open(filename.c_str());
            getNextLineAndSplitIntoTokens(ifs);

            line = getNextLineAndSplitIntoTokens(ifs);

            for (int k = 0; k < dims; k++)
                seismogramms.at(dims * path_index + k).data.resize((line.size()-1)/dims);

            for (int trace_i = 0; trace_i < num_of_receivers; trace_i++)
            {
                for (int k = 0; k < dims; k++)
                    seismogramms.at(dims * path_index + k).data[trace_i].resize(num_of_times);
            }
            times.resize(num_of_times);

            IndexType time_i = 0;
            while (line.size() >= num_of_all_traces + 1)
            {
                times[time_i] = ::atof(line[0].c_str());
                for (int trace_i = 0; trace_i < num_of_receivers; trace_i++)
                {
                    seismogramms.at(dims * path_index + 0).data[trace_i][time_i] = ::atof(line[1 + trace_i * dims].c_str());
                    seismogramms.at(dims * path_index + 1).data[trace_i][time_i] = ::atof(line[2 + trace_i * dims].c_str());
                    if (dims >= 3)
                        seismogramms.at(dims * path_index + 2).data[trace_i][time_i] = ::atof(line[3 + trace_i * dims].c_str());
                }
                line = getNextLineAndSplitIntoTokens(ifs);
                time_i++;
            }

            // Interpolating results on eqidistant time grid
            // ///////////////////////////////////////

            Scalar interval = (times[num_of_times-1] - times[0]) / (num_of_times - 1);
            interpolate_data_on_equal_time_intervals(interval * interpolation_multiplier);
            num_of_times = times.size();
            interval = times[1] - times[0];


            // Set binary header data
            // ///////////////////////////////////////
            struct segy_bin_header_data header_data;
            header_data.sample_interval = (uint32)(floor(interval * 1000000.0 + 0.5));
            header_data.sample_interval_reel = header_data.sample_interval;


            header_data.job_id = 1;
            header_data.line_num = 1;
            header_data.reel_num = 1;
            header_data.num_of_traces_per_record = num_of_receivers;
            header_data.num_of_auxiliary_traces_per_record = 0;
            header_data.data_sample_format = 5;
            header_data.reel_num = 1;
            header_data.samples_per_trace = num_of_times;
            header_data.samples_per_trace_reel = header_data.samples_per_trace;
            for (int i = 0; i < 17; i++)
                header_data.other[i] = 0;
            for (int i = 0; i < 170; i++)
                header_data.reserve[i] = 0;

            for (IndexType k = 0; k < dims; k++)
            {
                seismogramms[dims*path_index + k].header_data = header_data;
            }



            // Set trace header data
            // ///////////////////////////////////////

            // Reading receivers data
            std::string filename_rec = paths[path_index] + ".receivers.csv";
            std::ifstream ifs_rec;
            ifs_rec.open(filename_rec.c_str());
            std::vector<Scalar> rec_x;
            std::vector<Scalar> rec_y;
            if (ifs_rec)
            {
                for (IndexType i = 0; i < num_of_receivers; i++)
                {
                    std::vector<std::string> v = getNextLineAndSplitIntoTokens(ifs_rec);
                    if (v.size() < 2)
                    {
                        std::cout << "Error while reading receivers data" << std::endl;
                    }
                    else
                    {
                        rec_x.push_back(::atof(v.at(0).c_str()));
                        rec_y.push_back(::atof(v.at(1).c_str()));
                    }
                }
            }
            else
            {
                std::cout << "Warning: no csv receivers data found" << std::endl;
                std::cout << "         All receivers positions have been set to (0.0, 0.0)" << std::endl;
                for (IndexType i = 0; i < num_of_receivers; i++)
                {
                    rec_x.push_back(0.0);
                    rec_y.push_back(0.0);
                }
            }

            // Reading source data
            std::string filename_source = paths[path_index] + ".source.csv";
            std::ifstream ifs_source;
            ifs_source.open(filename_source.c_str());
            Scalar source_x;
            Scalar source_y;
            if (ifs_source)
            {
                std::vector<std::string> v = getNextLineAndSplitIntoTokens(ifs_source);
                if (v.size() < 2)
                {
                    std::cout << "Error while reading source data" << std::endl;
                }
                else
                {
                    source_x = ::atof(v.at(0).c_str());
                    source_y = ::atof(v.at(1).c_str());
                }
            }
            else
            {
                std::cout << "Warning: no csv source data found" << std::endl;
                std::cout << "         Source position has been set to (0.0, 0.0)" << std::endl;
                source_x = 0.0;
                source_y = 0.0;
            }

            // Setting trace headers data

            for (IndexType k = 0; k < dims; k++)
            {
                seismogramms[dims*path_index + k].trace_header_data.resize(num_of_receivers);
                for (int i = 0; i < num_of_receivers; i++)
                {
                    seismogramms[dims*path_index + k].trace_header_data[i].trace_seq_num_line = i;
                    seismogramms[dims*path_index + k].trace_header_data[i].trace_seq_num_reel = i;
                    seismogramms[dims*path_index + k].trace_header_data[i].trace_id_code = i;
                    seismogramms[dims*path_index + k].trace_header_data[i].receiver_x = rec_x[i];
                    seismogramms[dims*path_index + k].trace_header_data[i].receiver_y = rec_y[i];
                    seismogramms[dims*path_index + k].trace_header_data[i].source_x = source_x;
                    seismogramms[dims*path_index + k].trace_header_data[i].source_y = source_y;
                    seismogramms[dims*path_index + k].trace_header_data[i].field_record_num = 1;
                    seismogramms[dims*path_index + k].trace_header_data[i].num_of_samples = header_data.samples_per_trace;
                    seismogramms[dims*path_index + k].trace_header_data[i].sample_interval = header_data.sample_interval;
                    seismogramms[dims*path_index + k].trace_header_data[i].trace_num_reel = 1;
                    seismogramms[dims*path_index + k].trace_header_data[i].units_id = 1;
                    seismogramms[dims*path_index + k].trace_header_data[i].distance_from_source =
                            uint32(sqrt(Scalar((rec_x[i]-source_x)*(rec_x[i]-source_x) + (rec_y[i]-source_y)*(rec_y[i]-source_y)) + 0.5));
                }
            }


        }
    }
}